

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int moveToChild(BtCursor *pCur,u32 newPgno)

{
  char cVar1;
  BtShared *pBt_00;
  BtShared *pBt;
  u32 newPgno_local;
  BtCursor *pCur_local;
  
  pBt_00 = pCur->pBt;
  if (pCur->iPage < '\x13') {
    (pCur->info).nSize = 0;
    pCur->curFlags = pCur->curFlags & 0xf9;
    cVar1 = pCur->iPage;
    pCur->iPage = cVar1 + '\x01';
    pCur->aiIdx[cVar1] = pCur->ix;
    pCur->ix = 0;
    pCur_local._4_4_ =
         getAndInitPage(pBt_00,newPgno,pCur->apPage + pCur->iPage,pCur,(uint)pCur->curPagerFlags);
  }
  else {
    pCur_local._4_4_ = sqlite3CorruptError(0xfba2);
  }
  return pCur_local._4_4_;
}

Assistant:

static int moveToChild(BtCursor *pCur, u32 newPgno){
  BtShared *pBt = pCur->pBt;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage<BTCURSOR_MAX_DEPTH );
  assert( pCur->iPage>=0 );
  if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  pCur->aiIdx[pCur->iPage++] = pCur->ix;
  pCur->ix = 0;
  return getAndInitPage(pBt, newPgno, &pCur->apPage[pCur->iPage],
                        pCur, pCur->curPagerFlags);
}